

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
::iterator::operator*(iterator *this)

{
  reference in_RAX;
  
  if (this == (iterator *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
    ::iterator::operator*((iterator *)0x0);
  }
  else if (this != (iterator *)(kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&this->ctrl_) {
      return in_RAX;
    }
    goto LAB_00461ccd;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
  ::iterator::operator*((iterator *)this);
LAB_00461ccd:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
  ::iterator::operator*((iterator *)this);
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }